

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeControls(ProjectWriter *this)

{
  bool bVar1;
  vector<Control_*,_std::allocator<Control_*>_> *this_00;
  reference ppCVar2;
  ostream *poVar3;
  undefined1 local_50 [40];
  Control *control;
  iterator __end1;
  iterator __begin1;
  vector<Control_*,_std::allocator<Control_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[CONTROLS]\n");
  this_00 = &this->network->controls;
  __end1 = std::vector<Control_*,_std::allocator<Control_*>_>::begin(this_00);
  control = (Control *)std::vector<Control_*,_std::allocator<Control_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Control_**,_std::vector<Control_*,_std::allocator<Control_*>_>_>
                                *)&control);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<Control_**,_std::vector<Control_*,_std::allocator<Control_*>_>_>::
              operator*(&__end1);
    local_50._32_8_ = *ppCVar2;
    Control::toStr_abi_cxx11_((Control *)local_50,(Network *)local_50._32_8_);
    poVar3 = std::operator<<((ostream *)&this->field_0x18,(string *)local_50);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)local_50);
    __gnu_cxx::__normal_iterator<Control_**,_std::vector<Control_*,_std::allocator<Control_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeControls()
{
    fout << "\n[CONTROLS]\n";
    for (Control* control : network->controls)
    {
        fout << control->toStr(network) << "\n";
    }
}